

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

void __thiscall Assimp::Discreet3DSImporter::ParseMaterialChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  int8_t *piVar1;
  char cVar2;
  short sVar3;
  _IEEESingle temp;
  uint _limit;
  long lVar4;
  Logger *pLVar5;
  pointer pMVar6;
  Texture *pcOut;
  uint uVar7;
  float fVar9;
  ai_real aVar10;
  ai_real aVar11;
  Chunk chunk;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  ulong uVar8;
  
  do {
    do {
      if ((uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current) < 6) {
        return;
      }
      ReadChunk(this,&chunk);
    } while ((int)(chunk.Size - 6) < 1);
    this_00 = this->stream;
    _limit = StreamReader<false,_false>::SetReadLimit
                       (this_00,(chunk.Size - 6) +
                                (*(int *)&this_00->current - *(int *)&this_00->buffer));
    if (chunk.Flag == 0xa33d) {
      pcOut = &(this->mScene->mMaterials).
               super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1].sTexEmissive;
LAB_00365202:
      ParseTextureChunk(this,pcOut);
    }
    else if (chunk.Flag == 0xa010) {
      pMVar6 = (this->mScene->mMaterials).
               super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      ParseColorChunk(this,&pMVar6[-1].mAmbient,true);
      aVar11 = pMVar6[-1].mAmbient.r;
      if (((uint)aVar11 & 0x7fffff) != 0 && (~(uint)aVar11 & 0x7f800000) == 0) {
        pLVar5 = DefaultLogger::get();
        Logger::error(pLVar5,"3DS: Unable to read AMBIENT chunk");
        pMVar6[-1].mAmbient.b = 0.0;
        pMVar6[-1].mAmbient.r = 0.0;
        pMVar6[-1].mAmbient.g = 0.0;
      }
    }
    else if (chunk.Flag == 0xa020) {
      pMVar6 = (this->mScene->mMaterials).
               super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      ParseColorChunk(this,&pMVar6[-1].mDiffuse,true);
      aVar11 = pMVar6[-1].mDiffuse.r;
      if (((uint)aVar11 & 0x7fffff) != 0 && (~(uint)aVar11 & 0x7f800000) == 0) {
        pLVar5 = DefaultLogger::get();
        Logger::error(pLVar5,"3DS: Unable to read DIFFUSE chunk");
        pMVar6[-1].mDiffuse.b = 1.0;
        pMVar6[-1].mDiffuse.r = 1.0;
        pMVar6[-1].mDiffuse.g = 1.0;
      }
    }
    else if (chunk.Flag == 0xa030) {
      pMVar6 = (this->mScene->mMaterials).
               super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      ParseColorChunk(this,&pMVar6[-1].mSpecular,true);
      aVar11 = pMVar6[-1].mSpecular.r;
      if (((uint)aVar11 & 0x7fffff) != 0 && (~(uint)aVar11 & 0x7f800000) == 0) {
        pLVar5 = DefaultLogger::get();
        Logger::error(pLVar5,"3DS: Unable to read SPECULAR chunk");
        pMVar6[-1].mSpecular.b = 1.0;
        pMVar6[-1].mSpecular.r = 1.0;
        pMVar6[-1].mSpecular.g = 1.0;
      }
    }
    else if (chunk.Flag == 0xa040) {
      pMVar6 = (this->mScene->mMaterials).
               super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      aVar10 = ParsePercentageChunk(this);
      aVar11 = 0.0;
      if (((uint)aVar10 & 0x7fffff) == 0) {
        aVar11 = aVar10 * 65535.0;
      }
      if ((~(uint)aVar10 & 0x7f800000) != 0) {
        aVar11 = aVar10 * 65535.0;
      }
      pMVar6[-1].mSpecularExponent = aVar11;
    }
    else if (chunk.Flag == 0xa041) {
      pMVar6 = (this->mScene->mMaterials).
               super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      aVar10 = ParsePercentageChunk(this);
      aVar11 = 0.0;
      if (((uint)aVar10 & 0x7fffff) == 0) {
        aVar11 = aVar10 * 655.35;
      }
      if ((~(uint)aVar10 & 0x7f800000) != 0) {
        aVar11 = aVar10 * 655.35;
      }
      pMVar6[-1].mShininessStrength = aVar11;
    }
    else if (chunk.Flag == 0xa050) {
      pMVar6 = (this->mScene->mMaterials).
               super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      aVar10 = ParsePercentageChunk(this);
      fVar9 = (aVar10 * -65535.0) / 100.0 + 1.0;
      aVar11 = 1.0;
      if (((uint)aVar10 & 0x7fffff) == 0) {
        aVar11 = fVar9;
      }
      if ((~(uint)aVar10 & 0x7f800000) != 0) {
        aVar11 = fVar9;
      }
      pMVar6[-1].mTransparency = aVar11;
    }
    else if (chunk.Flag == 0xa080) {
      pMVar6 = (this->mScene->mMaterials).
               super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      ParseColorChunk(this,&pMVar6[-1].mEmissive,true);
      aVar11 = pMVar6[-1].mEmissive.r;
      if (((uint)aVar11 & 0x7fffff) != 0 && (~(uint)aVar11 & 0x7f800000) == 0) {
        pLVar5 = DefaultLogger::get();
        Logger::error(pLVar5,"3DS: Unable to read EMISSIVE chunk");
        pMVar6[-1].mEmissive.b = 0.0;
        pMVar6[-1].mEmissive.r = 0.0;
        pMVar6[-1].mEmissive.g = 0.0;
      }
    }
    else if (chunk.Flag == 0xa081) {
      (this->mScene->mMaterials).
      super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].mTwoSided = true;
    }
    else if (chunk.Flag == 0xa084) {
      aVar10 = ParsePercentageChunk(this);
      aVar11 = 0.0;
      if (((uint)aVar10 & 0x7fffff) == 0) {
        aVar11 = aVar10 * 655.35;
      }
      if ((~(uint)aVar10 & 0x7f800000) != 0) {
        aVar11 = aVar10 * 655.35;
      }
      pMVar6 = (this->mScene->mMaterials).
               super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pMVar6[-1].mEmissive.r = aVar11;
      pMVar6[-1].mEmissive.g = aVar11;
      pMVar6[-1].mEmissive.b = aVar11;
    }
    else {
      if (chunk.Flag != 0xa100) {
        if (chunk.Flag == 0xa200) {
          pMVar6 = (this->mScene->mMaterials).
                   super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar4 = -600;
        }
        else if (chunk.Flag == 0xa204) {
          pMVar6 = (this->mScene->mMaterials).
                   super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar4 = -0x1c8;
        }
        else if (chunk.Flag == 0xa210) {
          pMVar6 = (this->mScene->mMaterials).
                   super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar4 = -0x210;
        }
        else if (chunk.Flag == 0xa220) {
          pMVar6 = (this->mScene->mMaterials).
                   super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar4 = -0x180;
        }
        else if (chunk.Flag == 0xa230) {
          pMVar6 = (this->mScene->mMaterials).
                   super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar4 = -0x138;
        }
        else {
          if (chunk.Flag != 0xa33c) {
            if (chunk.Flag == 0xa000) {
              piVar1 = this->stream->current;
              uVar8 = 0xffffffffffffffff;
              do {
                cVar2 = StreamReader<false,_false>::Get<signed_char>(this->stream);
                uVar7 = (int)uVar8 + 1;
                uVar8 = (ulong)uVar7;
              } while (cVar2 != '\0');
              if (uVar7 == 0) {
                pLVar5 = DefaultLogger::get();
                Logger::error(pLVar5,"3DS: Empty material name");
              }
              else {
                local_50[0] = local_40;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_50,piVar1,piVar1 + uVar8);
                std::__cxx11::string::operator=
                          ((string *)
                           &(this->mScene->mMaterials).
                            super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].mName,(string *)local_50)
                ;
                std::__cxx11::string::~string((string *)local_50);
              }
            }
            goto LAB_0036520a;
          }
          pMVar6 = (this->mScene->mMaterials).
                   super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar4 = -0xa8;
        }
        pcOut = (Texture *)((long)&pMVar6->_vptr_Material + lVar4);
        goto LAB_00365202;
      }
      sVar3 = StreamReader<false,_false>::Get<short>(this->stream);
      (this->mScene->mMaterials).
      super__Vector_base<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].mShading = (int)sVar3;
    }
LAB_0036520a:
    this->stream->current = this->stream->limit;
    StreamReader<false,_false>::SetReadLimit(this->stream,_limit);
    if (*(int *)&this->stream->limit == *(int *)&this->stream->current) {
      return;
    }
  } while( true );
}

Assistant:

void Discreet3DSImporter::ParseMaterialChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_MAT_MATNAME:

        {
        // The material name string is already zero-terminated, but we need to be sure ...
        const char* sz = (const char*)stream->GetPtr();
        unsigned int cnt = 0;
        while (stream->GetI1())
            ++cnt;

        if (!cnt)   {
            // This may not be, we use the default name instead
            ASSIMP_LOG_ERROR("3DS: Empty material name");
        }
        else mScene->mMaterials.back().mName = std::string(sz,cnt);
        }
        break;

    case Discreet3DS::CHUNK_MAT_DIFFUSE:
        {
        // This is the diffuse material color
        aiColor3D* pc = &mScene->mMaterials.back().mDiffuse;
        ParseColorChunk(pc);
        if (is_qnan(pc->r)) {
            // color chunk is invalid. Simply ignore it
            ASSIMP_LOG_ERROR("3DS: Unable to read DIFFUSE chunk");
            pc->r = pc->g = pc->b = 1.0f;
        }}
        break;

    case Discreet3DS::CHUNK_MAT_SPECULAR:
        {
        // This is the specular material color
        aiColor3D* pc = &mScene->mMaterials.back().mSpecular;
        ParseColorChunk(pc);
        if (is_qnan(pc->r)) {
            // color chunk is invalid. Simply ignore it
            ASSIMP_LOG_ERROR("3DS: Unable to read SPECULAR chunk");
            pc->r = pc->g = pc->b = 1.0f;
        }}
        break;

    case Discreet3DS::CHUNK_MAT_AMBIENT:
        {
        // This is the ambient material color
        aiColor3D* pc = &mScene->mMaterials.back().mAmbient;
        ParseColorChunk(pc);
        if (is_qnan(pc->r)) {
            // color chunk is invalid. Simply ignore it
            ASSIMP_LOG_ERROR("3DS: Unable to read AMBIENT chunk");
            pc->r = pc->g = pc->b = 0.0f;
        }}
        break;

    case Discreet3DS::CHUNK_MAT_SELF_ILLUM:
        {
        // This is the emissive material color
        aiColor3D* pc = &mScene->mMaterials.back().mEmissive;
        ParseColorChunk(pc);
        if (is_qnan(pc->r)) {
            // color chunk is invalid. Simply ignore it
            ASSIMP_LOG_ERROR("3DS: Unable to read EMISSIVE chunk");
            pc->r = pc->g = pc->b = 0.0f;
        }}
        break;

    case Discreet3DS::CHUNK_MAT_TRANSPARENCY:
        {
            // This is the material's transparency
            ai_real* pcf = &mScene->mMaterials.back().mTransparency;
            *pcf = ParsePercentageChunk();

            // NOTE: transparency, not opacity
            if (is_qnan(*pcf))
                *pcf = ai_real( 1.0 );
            else 
                *pcf = ai_real( 1.0 ) - *pcf * (ai_real)0xFFFF / ai_real( 100.0 );
        }
        break;

    case Discreet3DS::CHUNK_MAT_SHADING:
        // This is the material shading mode
        mScene->mMaterials.back().mShading = (D3DS::Discreet3DS::shadetype3ds)stream->GetI2();
        break;

    case Discreet3DS::CHUNK_MAT_TWO_SIDE:
        // This is the two-sided flag
        mScene->mMaterials.back().mTwoSided = true;
        break;

    case Discreet3DS::CHUNK_MAT_SHININESS:
        { // This is the shininess of the material
        ai_real* pcf = &mScene->mMaterials.back().mSpecularExponent;
        *pcf = ParsePercentageChunk();
        if (is_qnan(*pcf))
            *pcf = 0.0;
        else *pcf *= (ai_real)0xFFFF;
        }
        break;

    case Discreet3DS::CHUNK_MAT_SHININESS_PERCENT:
        { // This is the shininess strength of the material
            ai_real* pcf = &mScene->mMaterials.back().mShininessStrength;
            *pcf = ParsePercentageChunk();
            if (is_qnan(*pcf))
                *pcf = ai_real( 0.0 );
            else 
                *pcf *= (ai_real)0xffff / ai_real( 100.0 );
        }
        break;

    case Discreet3DS::CHUNK_MAT_SELF_ILPCT:
        { // This is the self illumination strength of the material
            ai_real f = ParsePercentageChunk();
            if (is_qnan(f))
                f = ai_real( 0.0 );
            else 
                f *= (ai_real)0xFFFF / ai_real( 100.0 );
            mScene->mMaterials.back().mEmissive = aiColor3D(f,f,f);
        }
        break;

    // Parse texture chunks
    case Discreet3DS::CHUNK_MAT_TEXTURE:
        // Diffuse texture
        ParseTextureChunk(&mScene->mMaterials.back().sTexDiffuse);
        break;
    case Discreet3DS::CHUNK_MAT_BUMPMAP:
        // Height map
        ParseTextureChunk(&mScene->mMaterials.back().sTexBump);
        break;
    case Discreet3DS::CHUNK_MAT_OPACMAP:
        // Opacity texture
        ParseTextureChunk(&mScene->mMaterials.back().sTexOpacity);
        break;
    case Discreet3DS::CHUNK_MAT_MAT_SHINMAP:
        // Shininess map
        ParseTextureChunk(&mScene->mMaterials.back().sTexShininess);
        break;
    case Discreet3DS::CHUNK_MAT_SPECMAP:
        // Specular map
        ParseTextureChunk(&mScene->mMaterials.back().sTexSpecular);
        break;
    case Discreet3DS::CHUNK_MAT_SELFIMAP:
        // Self-illumination (emissive) map
        ParseTextureChunk(&mScene->mMaterials.back().sTexEmissive);
        break;
    case Discreet3DS::CHUNK_MAT_REFLMAP:
        // Reflection map
        ParseTextureChunk(&mScene->mMaterials.back().sTexReflective);
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}